

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primvar.hh
# Opt level: O3

void __thiscall
tinyusdz::primvar::PrimVar::set_value<tinyusdz::value::vector3h>(PrimVar *this,vector3h *v)

{
  storage_union local_20;
  undefined1 *local_10;
  
  local_10 = linb::any::vtable_for_type<tinyusdz::value::vector3h>()::table;
  local_20._0_2_ = v->x;
  local_20._2_2_ = v->y;
  local_20._4_2_ = (v->z).value;
  linb::any::swap((any *)&local_20,(any *)this);
  if (local_10 != (undefined1 *)0x0) {
    (**(code **)(local_10 + 0x20))(&local_20);
  }
  return;
}

Assistant:

void set_value(const T &v) {
    _value = v;
  }